

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trinload.cpp
# Opt level: O1

TrackData * __thiscall
TrinLoadDisk::load(TrackData *__return_storage_ptr__,TrinLoadDisk *this,CylHead *cylhead,
                  bool param_2)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Track track;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  Track local_70;
  Format local_4c;
  
  Trinity::read_track(&local_88,
                      (this->m_trinity)._M_t.
                      super___uniq_ptr_impl<Trinity,_std::default_delete<Trinity>_>._M_t.
                      super__Tuple_impl<0UL,_Trinity_*,_std::default_delete<Trinity>_>.
                      super__Head_base<0UL,_Trinity_*,_false>._M_head_impl,cylhead->cyl,
                      cylhead->head);
  Track::Track(&local_70,0);
  Format::Format(&local_4c,MGT);
  Track::format(&local_70,cylhead,&local_4c);
  Track::populate(&local_70,
                  (const_iterator)
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (const_iterator)
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish);
  TrackData::TrackData(__return_storage_ptr__,cylhead,&local_70);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_70.m_sectors);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        auto data = m_trinity->read_track(cylhead.cyl, cylhead.head);

        Track track;
        track.format(cylhead, RegularFormat::MGT);
        track.populate(data.begin(), data.end());
        return TrackData(cylhead, std::move(track));
    }